

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::remap_pls_variables(CompilerGLSL *this)

{
  bool bVar1;
  uint32_t id;
  SPIRType *pSVar2;
  reference pPVar3;
  SPIRVariable *pSVar4;
  CompilerError *pCVar5;
  SPIRVariable *var_1;
  PlsRemap *output;
  iterator __end1_1;
  iterator __begin1_1;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range1_1;
  SPIRType *type;
  bool input_is_target;
  SPIRVariable *var;
  PlsRemap *input;
  iterator __end1;
  iterator __begin1;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range1;
  CompilerGLSL *this_local;
  
  __end1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                     (&this->pls_inputs);
  input = (PlsRemap *)
          ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                    (&this->pls_inputs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                                *)&input);
    if (!bVar1) {
      __end1_1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                           (&this->pls_outputs);
      output = (PlsRemap *)
               ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                         (&this->pls_outputs);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                            *)&output);
        if (!bVar1) {
          return;
        }
        pPVar3 = __gnu_cxx::
                 __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                 ::operator*(&__end1_1);
        pSVar4 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,pPVar3->id);
        if (pSVar4->storage != Output) break;
        pSVar4->remapped_variable = true;
        __gnu_cxx::
        __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
        ::operator++(&__end1_1);
      }
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Can only use out variables for PLS outputs.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    pPVar3 = __gnu_cxx::
             __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
             ::operator*(&__end1);
    pSVar4 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,pPVar3->id);
    bVar1 = false;
    if (pSVar4->storage == StorageClassUniformConstant) {
      id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar4->super_IVariant).field_0xc);
      pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
      bVar1 = (pSVar2->image).dim == DimSubpassData;
    }
    if ((pSVar4->storage != Input) && (!bVar1)) break;
    pSVar4->remapped_variable = true;
    __gnu_cxx::
    __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
    ::operator++(&__end1);
  }
  pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(pCVar5,"Can only use in and target variables for PLS inputs.");
  __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerGLSL::remap_pls_variables()
{
	for (auto &input : pls_inputs)
	{
		auto &var = get<SPIRVariable>(input.id);

		bool input_is_target = false;
		if (var.storage == StorageClassUniformConstant)
		{
			auto &type = get<SPIRType>(var.basetype);
			input_is_target = type.image.dim == DimSubpassData;
		}

		if (var.storage != StorageClassInput && !input_is_target)
			SPIRV_CROSS_THROW("Can only use in and target variables for PLS inputs.");
		var.remapped_variable = true;
	}

	for (auto &output : pls_outputs)
	{
		auto &var = get<SPIRVariable>(output.id);
		if (var.storage != StorageClassOutput)
			SPIRV_CROSS_THROW("Can only use out variables for PLS outputs.");
		var.remapped_variable = true;
	}
}